

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::FuncArgsContext::markDstRegsDirty(FuncArgsContext *this,FuncFrame *frame)

{
  uint uVar1;
  Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL> *in_RDI;
  uint32_t regs;
  WorkData *wd;
  RegGroup group;
  Iterator __end2;
  Iterator __begin2;
  RegGroupVirtValues *__range2;
  undefined7 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  char local_63;
  char local_62;
  undefined1 local_61;
  undefined1 *local_60;
  undefined1 *local_48;
  undefined1 local_39;
  undefined1 *local_38;
  undefined1 local_29;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  WorkData *local_8;
  
  local_60 = &local_61;
  local_39 = 0;
  local_62 = '\0';
  local_29 = 4;
  local_63 = '\x04';
  local_48 = local_60;
  local_38 = local_60;
  while( true ) {
    local_20 = &local_62;
    local_28 = &local_63;
    if (local_62 == local_63) break;
    local_18 = &local_62;
    local_8 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
              operator[]<asmjit::v1_14::RegGroup>
                        (in_RDI,(RegGroup *)CONCAT17(local_62,in_stack_ffffffffffffff78));
    uVar1 = local_8->_usedRegs | local_8->_dstShuf;
    local_8->_workRegs = uVar1 | local_8->_workRegs;
    FuncFrame::addDirtyRegs
              ((FuncFrame *)CONCAT44(uVar1,in_stack_ffffffffffffff88),
               (RegGroup)((ulong)in_RDI >> 0x38),(RegMask)in_RDI);
    local_10 = &local_62;
    local_62 = local_62 + '\x01';
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::markDstRegsDirty(FuncFrame& frame) noexcept {
  for (RegGroup group : RegGroupVirtValues{}) {
    WorkData& wd = _workData[group];
    uint32_t regs = wd.usedRegs() | wd._dstShuf;

    wd._workRegs |= regs;
    frame.addDirtyRegs(group, regs);
  }

  return kErrorOk;
}